

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void do_note_off_extra(_note *nte)

{
  _note *nte_local;
  
  nte->is_off = '\0';
  if ((nte->modes & 0x40) == 0) {
    if ((nte->modes & 4) != 0) {
      nte->modes = nte->modes ^ 4;
    }
    nte->env_inc = 0;
  }
  else if (nte->hold == '\0') {
    if ((nte->modes & 0x20) == 0) {
      if ((nte->modes & 0x80) == 0) {
        if (nte->env < 4) {
          nte->env = '\x04';
          if (nte->sample->env_target[4] < nte->env_level) {
            nte->env_inc = -nte->sample->env_rate[4];
          }
          else {
            nte->env_inc = nte->sample->env_rate[4];
          }
        }
      }
      else if (nte->env < 5) {
        nte->env = '\x05';
        if (nte->sample->env_target[5] < nte->env_level) {
          nte->env_inc = -nte->sample->env_rate[5];
        }
        else {
          nte->env_inc = nte->sample->env_rate[5];
        }
      }
    }
    else if (nte->env < 3) {
      nte->env = '\x03';
      if (nte->sample->env_target[3] < nte->env_level) {
        nte->env_inc = -nte->sample->env_rate[3];
      }
      else {
        nte->env_inc = nte->sample->env_rate[3];
      }
    }
  }
  else {
    nte->hold = nte->hold | 2;
  }
  return;
}

Assistant:

static void do_note_off_extra(struct _note *nte) {

	nte->is_off = 0;


	if (!(nte->modes & SAMPLE_ENVELOPE)) {
		if (nte->modes & SAMPLE_LOOP) {
			nte->modes ^= SAMPLE_LOOP;
		}
		nte->env_inc = 0;

	} else if (nte->hold) {
		nte->hold |= HOLD_OFF;

	} else if (nte->modes & SAMPLE_SUSTAIN) {
		if (nte->env < 3) {
			nte->env = 3;
			if (nte->env_level > nte->sample->env_target[3]) {
				nte->env_inc = -nte->sample->env_rate[3];
			} else {
				nte->env_inc = nte->sample->env_rate[3];
			}
		}

	} else if (nte->modes & SAMPLE_CLAMPED) {
		if (nte->env < 5) {
			nte->env = 5;
			if (nte->env_level > nte->sample->env_target[5]) {
				nte->env_inc = -nte->sample->env_rate[5];
			} else {
				nte->env_inc = nte->sample->env_rate[5];
			}
		}
	} else if (nte->env < 4) {
		nte->env = 4;
		if (nte->env_level > nte->sample->env_target[4]) {
			nte->env_inc = -nte->sample->env_rate[4];
		} else {
			nte->env_inc = nte->sample->env_rate[4];
		}
	}
}